

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array_util.h
# Opt level: O2

void b_array::insert_item<Map::Pair<std::__cxx11::string,Table>>
               (Array<Map::Pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Table>_>
                *data,size_t pos,size_t *size,
               Pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Table>
               *entry)

{
  Pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Table>
  *pPVar1;
  Pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Table> *this
  ;
  size_t index;
  
  index = *size;
  *size = index + 1;
  while (pos < index) {
    pPVar1 = Array<Map::Pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Table>_>
             ::operator[](data,index - 1);
    this = Array<Map::Pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Table>_>
           ::operator[](data,index);
    Map::
    Pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Table>::
    operator=(this,pPVar1);
    index = index - 1;
  }
  pPVar1 = Array<Map::Pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Table>_>
           ::operator[](data,pos);
  Map::Pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Table>
  ::operator=(pPVar1,entry);
  return;
}

Assistant:

void insert_item(b_array::Array<T>& data, size_t pos, size_t& size, const T& entry) {
    for (size_t i = size++; i > pos; i--) {
        data[i] = data[i - 1];
    }
    data[pos] = entry;
}